

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserunits.cpp
# Opt level: O3

void __thiscall AnalyserUnits_powerValues_Test::TestBody(AnalyserUnits_powerValues_Test *this)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  long *plVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  ScopedTrace gtest_trace_896;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expectedIssues;
  ModelPtr model;
  ParserPtr parser;
  AnalyserPtr analyser;
  ScopedTrace local_991;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_990;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_988;
  undefined1 local_980 [32];
  string local_960 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_958;
  undefined1 local_950 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_940;
  undefined1 *local_920 [2];
  undefined1 local_910 [16];
  undefined1 *local_900 [2];
  undefined1 local_8f0 [16];
  undefined1 *local_8e0 [2];
  undefined1 local_8d0 [16];
  undefined1 *local_8c0 [2];
  undefined1 local_8b0 [16];
  undefined1 *local_8a0 [2];
  undefined1 local_890 [16];
  undefined1 *local_880 [2];
  undefined1 local_870 [16];
  undefined1 *local_860 [2];
  undefined1 local_850 [16];
  undefined1 *local_840 [2];
  undefined1 local_830 [16];
  undefined1 *local_820 [2];
  undefined1 local_810 [16];
  undefined1 *local_800 [2];
  undefined1 local_7f0 [16];
  undefined1 *local_7e0 [2];
  undefined1 local_7d0 [16];
  undefined1 *local_7c0 [2];
  undefined1 local_7b0 [16];
  undefined1 *local_7a0 [2];
  undefined1 local_790 [16];
  undefined1 *local_780 [2];
  undefined1 local_770 [16];
  undefined1 *local_760 [2];
  undefined1 local_750 [16];
  undefined1 *local_740 [2];
  undefined1 local_730 [16];
  undefined1 *local_720 [2];
  undefined1 local_710 [16];
  undefined1 *local_700 [2];
  undefined1 local_6f0 [16];
  undefined1 *local_6e0 [2];
  undefined1 local_6d0 [16];
  undefined1 *local_6c0 [2];
  undefined1 local_6b0 [16];
  undefined1 *local_6a0 [2];
  undefined1 local_690 [16];
  undefined1 *local_680 [2];
  undefined1 local_670 [16];
  undefined1 *local_660 [2];
  undefined1 local_650 [16];
  undefined1 *local_640 [2];
  undefined1 local_630 [16];
  undefined1 *local_620 [2];
  undefined1 local_610 [16];
  undefined1 *local_600 [2];
  undefined1 local_5f0 [16];
  undefined1 *local_5e0 [2];
  undefined1 local_5d0 [16];
  undefined1 *local_5c0 [2];
  undefined1 local_5b0 [16];
  undefined1 *local_5a0 [2];
  undefined1 local_590 [16];
  undefined1 *local_580 [2];
  undefined1 local_570 [16];
  undefined1 *local_560 [2];
  undefined1 local_550 [16];
  undefined1 *local_540 [2];
  undefined1 local_530 [16];
  undefined1 *local_520 [2];
  undefined1 local_510 [16];
  undefined1 *local_500 [2];
  undefined1 local_4f0 [16];
  undefined1 *local_4e0 [2];
  undefined1 local_4d0 [16];
  undefined1 *local_4c0 [2];
  undefined1 local_4b0 [16];
  undefined1 *local_4a0 [2];
  undefined1 local_490 [16];
  undefined1 *local_480 [2];
  undefined1 local_470 [16];
  undefined1 *local_460 [2];
  undefined1 local_450 [16];
  undefined1 *local_440 [2];
  undefined1 local_430 [16];
  undefined1 *local_420 [2];
  undefined1 local_410 [16];
  undefined1 *local_400 [2];
  undefined1 local_3f0 [16];
  undefined1 *local_3e0 [2];
  undefined1 local_3d0 [16];
  undefined1 *local_3c0 [2];
  undefined1 local_3b0 [16];
  undefined1 *local_3a0 [2];
  undefined1 local_390 [16];
  undefined1 *local_380 [2];
  undefined1 local_370 [16];
  undefined1 *local_360 [2];
  undefined1 local_350 [16];
  undefined1 *local_340 [2];
  undefined1 local_330 [16];
  undefined1 *local_320 [2];
  undefined1 local_310 [16];
  undefined1 *local_300 [2];
  undefined1 local_2f0 [16];
  undefined1 *local_2e0 [2];
  undefined1 local_2d0 [16];
  undefined1 *local_2c0 [2];
  undefined1 local_2b0 [16];
  undefined1 *local_2a0 [2];
  undefined1 local_290 [16];
  undefined1 *local_280 [2];
  undefined1 local_270 [16];
  undefined1 *local_260 [2];
  undefined1 local_250 [16];
  undefined1 *local_240 [2];
  undefined1 local_230 [16];
  undefined1 *local_220 [2];
  undefined1 local_210 [16];
  undefined1 *local_200 [2];
  undefined1 local_1f0 [16];
  undefined1 *local_1e0 [2];
  undefined1 local_1d0 [16];
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  undefined1 *local_1a0 [2];
  undefined1 local_190 [16];
  undefined1 *local_180 [2];
  undefined1 local_170 [16];
  undefined1 *local_160 [2];
  undefined1 local_150 [16];
  undefined1 *local_140 [2];
  undefined1 local_130 [16];
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  long *local_40 [2];
  long local_30 [2];
  
  libcellml::Parser::create(SUB81(local_950,0));
  local_980._0_8_ = (pointer)(local_980 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_980,"analyser/units/power_values.cellml","");
  fileContents((string *)&local_940);
  libcellml::Parser::parseModel(local_960);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_940._M_dataplus._M_p != &local_940.field_2) {
    operator_delete(local_940._M_dataplus._M_p,local_940.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_980._0_8_ != (pointer)(local_980 + 0x10)) {
    operator_delete((void *)local_980._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_980._16_8_)->_M_p + 1));
  }
  local_980._0_8_ = (pointer)0x0;
  local_990 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_940,"size_t(0)","parser->issueCount()",(unsigned_long *)local_980,
             (unsigned_long *)&local_990);
  if ((char)local_940._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_980);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_940._M_string_length ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)(undefined1 *)local_940._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_990,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserunits.cpp"
               ,0x32e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_990,(Message *)local_980);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_990);
    if ((pointer)local_980._0_8_ != (pointer)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && ((pointer)local_980._0_8_ != (pointer)0x0)) {
        (**(code **)(((_Alloc_hider *)local_980._0_8_)->_M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_940._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_940._M_dataplus._M_p = (pointer)&local_940.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_940,
             "The units in \'eqnEq = pow(x, 3.0 == 5.0)\' in component \'my_component\' are not equivalent. \'eqnEq\' is in \'second\' while \'pow(x, 3.0 == 5.0)\' is \'dimensionless\'."
             ,"");
  local_920[0] = local_910;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_920,
             "The units in \'eqnGt = pow(x, 3.0 > 5.0)\' in component \'my_component\' are not equivalent. \'eqnGt\' is in \'second\' while \'pow(x, 3.0 > 5.0)\' is \'dimensionless\'."
             ,"");
  local_900[0] = local_8f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_900,
             "The units in \'eqnGeq = pow(x, 3.0 >= 5.0)\' in component \'my_component\' are not equivalent. \'eqnGeq\' is in \'second\' while \'pow(x, 3.0 >= 5.0)\' is \'dimensionless\'."
             ,"");
  local_8e0[0] = local_8d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8e0,
             "The units in \'eqnAnd2 = pow(x, !3.0 && 5.0)\' in component \'my_component\' are not equivalent. \'eqnAnd2\' is in \'second\' while \'pow(x, !3.0 && 5.0)\' is \'dimensionless\'."
             ,"");
  local_8c0[0] = local_8b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8c0,
             "The units in \'eqnAnd3 = pow(x, 3.0 && !5.0)\' in component \'my_component\' are not equivalent. \'eqnAnd3\' is in \'second\' while \'pow(x, 3.0 && !5.0)\' is \'dimensionless\'."
             ,"");
  local_8a0[0] = local_890;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8a0,
             "The units in \'eqnOr3 = pow(x, !3.0 || !5.0)\' in component \'my_component\' are not equivalent. \'eqnOr3\' is in \'second\' while \'pow(x, !3.0 || !5.0)\' is \'dimensionless\'."
             ,"");
  local_880[0] = local_870;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_880,
             "The units in \'eqnXor = pow(x, xor(3.0, 5.0))\' in component \'my_component\' are not equivalent. \'eqnXor\' is in \'second\' while \'pow(x, xor(3.0, 5.0))\' is \'dimensionless\'."
             ,"");
  local_860[0] = local_850;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_860,
             "The units in \'eqnNot = pow(x, !3.0)\' in component \'my_component\' are not equivalent. \'eqnNot\' is in \'second\' while \'pow(x, !3.0)\' is \'dimensionless\'."
             ,"");
  local_840[0] = local_830;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_840,
             "The units in \'eqnPlus = pow(x, 3.0)\' in component \'my_component\' are not equivalent. \'eqnPlus\' is in \'second\' while \'pow(x, 3.0)\' is in \'second^3\'."
             ,"");
  local_820[0] = local_810;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_820,
             "The units in \'eqnPlus2 = pow(x, 3.0+5.0)\' in component \'my_component\' are not equivalent. \'eqnPlus2\' is in \'second\' while \'pow(x, 3.0+5.0)\' is in \'second^8\'."
             ,"");
  local_800[0] = local_7f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_800,
             "The units in \'eqnMinus = pow(x, -3.0)\' in component \'my_component\' are not equivalent. \'eqnMinus\' is in \'second\' while \'pow(x, -3.0)\' is in \'second^-3\'."
             ,"");
  local_7e0[0] = local_7d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7e0,
             "The units in \'eqnMinus2 = pow(x, 3.0-5.0)\' in component \'my_component\' are not equivalent. \'eqnMinus2\' is in \'second\' while \'pow(x, 3.0-5.0)\' is in \'second^-2\'."
             ,"");
  local_7c0[0] = local_7b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7c0,
             "The units in \'eqnTimes = pow(x, 3.0*5.0)\' in component \'my_component\' are not equivalent. \'eqnTimes\' is in \'second\' while \'pow(x, 3.0*5.0)\' is in \'second^15\'."
             ,"");
  local_7a0[0] = local_790;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7a0,
             "The units in \'eqnDivide = pow(x, 3.0/5.0)\' in component \'my_component\' are not equivalent. \'eqnDivide\' is in \'second\' while \'pow(x, 3.0/5.0)\' is in \'second^0.6\'."
             ,"");
  local_780[0] = local_770;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_780,
             "The units in \'eqnPower = pow(x, pow(3.0, 5.0))\' in component \'my_component\' are not equivalent. \'eqnPower\' is in \'second\' while \'pow(x, pow(3.0, 5.0))\' is in \'second^243\'."
             ,"");
  local_760[0] = local_750;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_760,
             "The units in \'eqnRoot = pow(x, pow(3.0, 1.0/5.0))\' in component \'my_component\' are not equivalent. \'eqnRoot\' is in \'second\' while \'pow(x, pow(3.0, 1.0/5.0))\' is in \'second^1.24573\'."
             ,"");
  local_740[0] = local_730;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_740,
             "The units in \'eqnRoot2 = pow(x, sqrt(3.0))\' in component \'my_component\' are not equivalent. \'eqnRoot2\' is in \'second\' while \'pow(x, sqrt(3.0))\' is in \'second^1.73205\'."
             ,"");
  local_720[0] = local_710;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_720,
             "The units in \'eqnAbs = pow(x, abs(-3.0))\' in component \'my_component\' are not equivalent. \'eqnAbs\' is in \'second\' while \'pow(x, abs(-3.0))\' is in \'second^3\'."
             ,"");
  local_700[0] = local_6f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_700,
             "The units in \'eqnExp = pow(x, exp(3.0))\' in component \'my_component\' are not equivalent. \'eqnExp\' is in \'second\' while \'pow(x, exp(3.0))\' is in \'second^20.0855\'."
             ,"");
  local_6e0[0] = local_6d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6e0,
             "The units in \'eqnLn = pow(x, ln(3.0))\' in component \'my_component\' are not equivalent. \'eqnLn\' is in \'second\' while \'pow(x, ln(3.0))\' is in \'second^1.09861\'."
             ,"");
  local_6c0[0] = local_6b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6c0,
             "The units in \'eqnLog = pow(x, log(3.0))\' in component \'my_component\' are not equivalent. \'eqnLog\' is in \'second\' while \'pow(x, log(3.0))\' is in \'second^0.477121\'."
             ,"");
  local_6a0[0] = local_690;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6a0,
             "The units in \'eqnLog2 = pow(x, ln(3.0)/ln(2.0))\' in component \'my_component\' are not equivalent. \'eqnLog2\' is in \'second\' while \'pow(x, ln(3.0)/ln(2.0))\' is in \'second^1.58496\'."
             ,"");
  local_680[0] = local_670;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_680,
             "The units in \'eqnLog10 = pow(x, log(3.0))\' in component \'my_component\' are not equivalent. \'eqnLog10\' is in \'second\' while \'pow(x, log(3.0))\' is in \'second^0.477121\'."
             ,"");
  local_660[0] = local_650;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_660,
             "The units in \'eqnCeiling = pow(x, ceil(3.21))\' in component \'my_component\' are not equivalent. \'eqnCeiling\' is in \'second\' while \'pow(x, ceil(3.21))\' is in \'second^4\'."
             ,"");
  local_640[0] = local_630;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_640,
             "The units in \'eqnFloor = pow(x, floor(3.21))\' in component \'my_component\' are not equivalent. \'eqnFloor\' is in \'second\' while \'pow(x, floor(3.21))\' is in \'second^3\'."
             ,"");
  local_620[0] = local_610;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_620,
             "The units in \'eqnMin = pow(x, min(3.0, 5.0))\' in component \'my_component\' are not equivalent. \'eqnMin\' is in \'second\' while \'pow(x, min(3.0, 5.0))\' is in \'second^3\'."
             ,"");
  local_600[0] = local_5f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_600,
             "The units in \'eqnMin2 = pow(x, min(5.0, 3.0))\' in component \'my_component\' are not equivalent. \'eqnMin2\' is in \'second\' while \'pow(x, min(5.0, 3.0))\' is in \'second^3\'."
             ,"");
  local_5e0[0] = local_5d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5e0,
             "The units in \'eqnMax = pow(x, max(3.0, 5.0))\' in component \'my_component\' are not equivalent. \'eqnMax\' is in \'second\' while \'pow(x, max(3.0, 5.0))\' is in \'second^5\'."
             ,"");
  local_5c0[0] = local_5b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5c0,
             "The units in \'eqnMax2 = pow(x, max(5.0, 3.0))\' in component \'my_component\' are not equivalent. \'eqnMax2\' is in \'second\' while \'pow(x, max(5.0, 3.0))\' is in \'second^5\'."
             ,"");
  local_5a0[0] = local_590;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5a0,
             "The units in \'eqnRem = pow(x, rem(3.0, 5.0))\' in component \'my_component\' are not equivalent. \'eqnRem\' is in \'second\' while \'pow(x, rem(3.0, 5.0))\' is in \'second^3\'."
             ,"");
  local_580[0] = local_570;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_580,
             "The units in \'eqnDiff = pow(x, dx/dt)\' in component \'my_component\' may not be equivalent. \'eqnDiff\' is in \'second\' while \'dx/dt\' may result in \'pow(x, dx/dt)\' having different units."
             ,"");
  local_560[0] = local_550;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_560,
             "The units in \'pow(x, dx/dt) = eqnDiff2\' in component \'my_component\' may not be equivalent. \'dx/dt\' may result in \'pow(x, dx/dt)\' having different units while \'eqnDiff2\' is in \'second\'."
             ,"");
  local_540[0] = local_530;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_540,
             "The units in \'pow(x, dx/dt) = pow(xx, dxx/dt)\' in component \'my_component\' may not be equivalent. \'dx/dt\' may result in \'pow(x, dx/dt)\' having different units while \'dxx/dt\' may result in \'pow(xx, dxx/dt)\' having different units."
             ,"");
  local_520[0] = local_510;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_520,
             "The units in \'eqnSin = pow(x, sin(3.0))\' in component \'my_component\' are not equivalent. \'eqnSin\' is in \'second\' while \'pow(x, sin(3.0))\' is in \'second^0.14112\'."
             ,"");
  local_500[0] = local_4f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_500,
             "The units in \'eqnCos = pow(x, cos(3.0))\' in component \'my_component\' are not equivalent. \'eqnCos\' is in \'second\' while \'pow(x, cos(3.0))\' is in \'second^-0.989992\'."
             ,"");
  local_4e0[0] = local_4d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4e0,
             "The units in \'eqnTan = pow(x, tan(3.0))\' in component \'my_component\' are not equivalent. \'eqnTan\' is in \'second\' while \'pow(x, tan(3.0))\' is in \'second^-0.142547\'."
             ,"");
  local_4c0[0] = local_4b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4c0,
             "The units in \'eqnSec = pow(x, sec(3.0))\' in component \'my_component\' are not equivalent. \'eqnSec\' is in \'second\' while \'pow(x, sec(3.0))\' is in \'second^-1.01011\'."
             ,"");
  local_4a0[0] = local_490;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4a0,
             "The units in \'eqnCsc = pow(x, csc(3.0))\' in component \'my_component\' are not equivalent. \'eqnCsc\' is in \'second\' while \'pow(x, csc(3.0))\' is in \'second^7.08617\'."
             ,"");
  local_480[0] = local_470;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_480,
             "The units in \'eqnCot = pow(x, cot(3.0))\' in component \'my_component\' are not equivalent. \'eqnCot\' is in \'second\' while \'pow(x, cot(3.0))\' is in \'second^-7.01525\'."
             ,"");
  local_460[0] = local_450;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_460,
             "The units in \'eqnSinh = pow(x, sinh(3.0))\' in component \'my_component\' are not equivalent. \'eqnSinh\' is in \'second\' while \'pow(x, sinh(3.0))\' is in \'second^10.0179\'."
             ,"");
  local_440[0] = local_430;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_440,
             "The units in \'eqnCosh = pow(x, cosh(3.0))\' in component \'my_component\' are not equivalent. \'eqnCosh\' is in \'second\' while \'pow(x, cosh(3.0))\' is in \'second^10.0677\'."
             ,"");
  local_420[0] = local_410;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_420,
             "The units in \'eqnTanh = pow(x, tanh(3.0))\' in component \'my_component\' are not equivalent. \'eqnTanh\' is in \'second\' while \'pow(x, tanh(3.0))\' is in \'second^0.995055\'."
             ,"");
  local_400[0] = local_3f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_400,
             "The units in \'eqnSech = pow(x, sech(3.0))\' in component \'my_component\' are not equivalent. \'eqnSech\' is in \'second\' while \'pow(x, sech(3.0))\' is in \'second^0.0993279\'."
             ,"");
  local_3e0[0] = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3e0,
             "The units in \'eqnCsch = pow(x, csch(3.0))\' in component \'my_component\' are not equivalent. \'eqnCsch\' is in \'second\' while \'pow(x, csch(3.0))\' is in \'second^0.0998216\'."
             ,"");
  local_3c0[0] = local_3b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3c0,
             "The units in \'eqnCoth = pow(x, coth(3.0))\' in component \'my_component\' are not equivalent. \'eqnCoth\' is in \'second\' while \'pow(x, coth(3.0))\' is in \'second^1.00497\'."
             ,"");
  local_3a0[0] = local_390;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3a0,
             "The units in \'eqnArcsin = pow(x, arcsin(0.3))\' in component \'my_component\' are not equivalent. \'eqnArcsin\' is in \'second\' while \'pow(x, arcsin(0.3))\' is in \'second^0.304693\'."
             ,"");
  local_380[0] = local_370;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_380,
             "The units in \'eqnArccos = pow(x, arccos(0.3))\' in component \'my_component\' are not equivalent. \'eqnArccos\' is in \'second\' while \'pow(x, arccos(0.3))\' is in \'second^1.2661\'."
             ,"");
  local_360[0] = local_350;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_360,
             "The units in \'eqnArctan = pow(x, arctan(3.0))\' in component \'my_component\' are not equivalent. \'eqnArctan\' is in \'second\' while \'pow(x, arctan(3.0))\' is in \'second^1.24905\'."
             ,"");
  local_340[0] = local_330;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_340,
             "The units in \'eqnArcsec = pow(x, arcsec(3.0))\' in component \'my_component\' are not equivalent. \'eqnArcsec\' is in \'second\' while \'pow(x, arcsec(3.0))\' is in \'second^1.23096\'."
             ,"");
  local_320[0] = local_310;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_320,
             "The units in \'eqnArccsc = pow(x, arccsc(3.0))\' in component \'my_component\' are not equivalent. \'eqnArccsc\' is in \'second\' while \'pow(x, arccsc(3.0))\' is in \'second^0.339837\'."
             ,"");
  local_300[0] = local_2f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_300,
             "The units in \'eqnArccot = pow(x, arccot(3.0))\' in component \'my_component\' are not equivalent. \'eqnArccot\' is in \'second\' while \'pow(x, arccot(3.0))\' is in \'second^0.321751\'."
             ,"");
  local_2e0[0] = local_2d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2e0,
             "The units in \'eqnArcsinh = pow(x, arcsinh(3.0))\' in component \'my_component\' are not equivalent. \'eqnArcsinh\' is in \'second\' while \'pow(x, arcsinh(3.0))\' is in \'second^1.81845\'."
             ,"");
  local_2c0[0] = local_2b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2c0,
             "The units in \'eqnArccosh = pow(x, arccosh(3.0))\' in component \'my_component\' are not equivalent. \'eqnArccosh\' is in \'second\' while \'pow(x, arccosh(3.0))\' is in \'second^1.76275\'."
             ,"");
  local_2a0[0] = local_290;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2a0,
             "The units in \'eqnArctanh = pow(x, arctanh(0.3))\' in component \'my_component\' are not equivalent. \'eqnArctanh\' is in \'second\' while \'pow(x, arctanh(0.3))\' is in \'second^0.30952\'."
             ,"");
  local_280[0] = local_270;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_280,
             "The units in \'eqnArcsech = pow(x, arcsech(0.3))\' in component \'my_component\' are not equivalent. \'eqnArcsech\' is in \'second\' while \'pow(x, arcsech(0.3))\' is in \'second^1.87382\'."
             ,"");
  local_260[0] = local_250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_260,
             "The units in \'eqnArccsch = pow(x, arccsch(3.0))\' in component \'my_component\' are not equivalent. \'eqnArccsch\' is in \'second\' while \'pow(x, arccsch(3.0))\' is in \'second^0.32745\'."
             ,"");
  local_240[0] = local_230;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_240,
             "The units in \'eqnArccoth = pow(x, arccoth(3.0))\' in component \'my_component\' are not equivalent. \'eqnArccoth\' is in \'second\' while \'pow(x, arccoth(3.0))\' is in \'second^0.346574\'."
             ,"");
  local_220[0] = local_210;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_220,
             "The units in \'eqnPiecewise = pow(x, (y > 5.0)?3.0:7.0)\' in component \'my_component\' may not be equivalent. \'eqnPiecewise\' is in \'second\' while \'(y > 5.0)?3.0:7.0\' may result in \'pow(x, (y > 5.0)?3.0:7.0)\' having different units."
             ,"");
  local_200[0] = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_200,
             "The units in \'eqnCi = pow(x, y)\' in component \'my_component\' are not equivalent. \'eqnCi\' is in \'second\' while \'pow(x, y)\' is in \'second^3\'."
             ,"");
  local_1e0[0] = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e0,
             "The units in \'eqnCi2 = pow(x, z)\' in component \'my_component\' are equivalent as long as the value of \'z\' is equal to \'1.0\'."
             ,"");
  local_1c0[0] = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c0,
             "The units in \'eqnCi3 = pow(x, 3.0*z)\' in component \'my_component\' are equivalent as long as the value of \'3.0*z\' is equal to \'3.0\'."
             ,"");
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a0,
             "The units in \'eqnCi4 = pow(x, y+z)\' in component \'my_component\' are equivalent as long as the value of \'y+z\' is equal to \'4.0\'."
             ,"");
  local_180[0] = local_170;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_180,
             "The units in \'eqnCi5 = pow(x, pow(y-z, y-z)+1.0)\' in component \'my_component\' are equivalent as long as the value of \'pow(y-z, y-z)+1.0\' is equal to \'5.0\'."
             ,"");
  local_160[0] = local_150;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_160,
             "The units in \'eqnCn = pow(x, 3.0)\' in component \'my_component\' are not equivalent. \'eqnCn\' is in \'second\' while \'pow(x, 3.0)\' is in \'second^3\'."
             ,"");
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_140,
             "The units in \'eqnFalse = pow(x, false)\' in component \'my_component\' are not equivalent. \'eqnFalse\' is in \'second\' while \'pow(x, false)\' is \'dimensionless\'."
             ,"");
  local_120[0] = local_110;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_120,
             "The units in \'eqnExponentiale = pow(x, exponentiale)\' in component \'my_component\' are not equivalent. \'eqnExponentiale\' is in \'second\' while \'pow(x, exponentiale)\' is in \'second^2.71828\'."
             ,"");
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_100,
             "The units in \'eqnPi = pow(x, pi)\' in component \'my_component\' are not equivalent. \'eqnPi\' is in \'second\' while \'pow(x, pi)\' is in \'second^3.14159\'."
             ,"");
  local_e0[0] = local_d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e0,
             "The units in \'eqnInfinity = pow(x, infinity)\' in component \'my_component\' are not equivalent. \'eqnInfinity\' is in \'second\' while \'pow(x, infinity)\' is in \'second^inf\' (i.e. \'10^nan x second^inf\')."
             ,"");
  local_c0[0] = local_b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c0,
             "The units in \'eqnNotanumber = pow(x, notanumber)\' in component \'my_component\' are not equivalent. \'eqnNotanumber\' is in \'second\' while \'pow(x, notanumber)\' is in \'second^nan\' (i.e. \'10^nan x second^nan\')."
             ,"");
  local_a0[0] = local_90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a0,
             "The type of variable \'u\' in component \'my_component\' is unknown.","");
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_80,
             "The type of variable \'eqnCoverage\' in component \'my_component\' is unknown.","");
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_60,
             "The type of variable \'eqnCoverage2\' in component \'my_component\' is unknown.","");
  plVar4 = local_30;
  local_40[0] = plVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,
             "The type of variable \'eqnCoverage3\' in component \'my_component\' is unknown.","");
  __l._M_len = 0x49;
  __l._M_array = &local_940;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_980,__l,(allocator_type *)&local_990);
  lVar2 = -0x920;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -4;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0);
  libcellml::Analyser::create();
  libcellml::Analyser::analyseModel((shared_ptr *)local_940._M_dataplus._M_p);
  testing::ScopedTrace::ScopedTrace
            (&local_991,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserunits.cpp"
             ,0x380,"Issue occurred here.");
  local_990 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_940._M_dataplus._M_p;
  local_988 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_940._M_string_length;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_940._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_940._M_string_length + 8) = *(int *)(local_940._M_string_length + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_940._M_string_length + 8) = *(int *)(local_940._M_string_length + 8) + 1;
    }
  }
  expectEqualIssues((vector *)local_980,(shared_ptr *)&local_990);
  if (local_988 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_988);
  }
  testing::ScopedTrace::~ScopedTrace(&local_991);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_940._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_940._M_string_length);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_980);
  if (local_958 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_958);
  }
  if (local_948 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_948);
  }
  return;
}

Assistant:

TEST(AnalyserUnits, powerValues)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("analyser/units/power_values.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    const std::vector<std::string> expectedIssues = {
        "The units in 'eqnEq = pow(x, 3.0 == 5.0)' in component 'my_component' are not equivalent. 'eqnEq' is in 'second' while 'pow(x, 3.0 == 5.0)' is 'dimensionless'.",
        "The units in 'eqnGt = pow(x, 3.0 > 5.0)' in component 'my_component' are not equivalent. 'eqnGt' is in 'second' while 'pow(x, 3.0 > 5.0)' is 'dimensionless'.",
        "The units in 'eqnGeq = pow(x, 3.0 >= 5.0)' in component 'my_component' are not equivalent. 'eqnGeq' is in 'second' while 'pow(x, 3.0 >= 5.0)' is 'dimensionless'.",
        "The units in 'eqnAnd2 = pow(x, !3.0 && 5.0)' in component 'my_component' are not equivalent. 'eqnAnd2' is in 'second' while 'pow(x, !3.0 && 5.0)' is 'dimensionless'.",
        "The units in 'eqnAnd3 = pow(x, 3.0 && !5.0)' in component 'my_component' are not equivalent. 'eqnAnd3' is in 'second' while 'pow(x, 3.0 && !5.0)' is 'dimensionless'.",
        "The units in 'eqnOr3 = pow(x, !3.0 || !5.0)' in component 'my_component' are not equivalent. 'eqnOr3' is in 'second' while 'pow(x, !3.0 || !5.0)' is 'dimensionless'.",
        "The units in 'eqnXor = pow(x, xor(3.0, 5.0))' in component 'my_component' are not equivalent. 'eqnXor' is in 'second' while 'pow(x, xor(3.0, 5.0))' is 'dimensionless'.",
        "The units in 'eqnNot = pow(x, !3.0)' in component 'my_component' are not equivalent. 'eqnNot' is in 'second' while 'pow(x, !3.0)' is 'dimensionless'.",
        "The units in 'eqnPlus = pow(x, 3.0)' in component 'my_component' are not equivalent. 'eqnPlus' is in 'second' while 'pow(x, 3.0)' is in 'second^3'.",
        "The units in 'eqnPlus2 = pow(x, 3.0+5.0)' in component 'my_component' are not equivalent. 'eqnPlus2' is in 'second' while 'pow(x, 3.0+5.0)' is in 'second^8'.",
        "The units in 'eqnMinus = pow(x, -3.0)' in component 'my_component' are not equivalent. 'eqnMinus' is in 'second' while 'pow(x, -3.0)' is in 'second^-3'.",
        "The units in 'eqnMinus2 = pow(x, 3.0-5.0)' in component 'my_component' are not equivalent. 'eqnMinus2' is in 'second' while 'pow(x, 3.0-5.0)' is in 'second^-2'.",
        "The units in 'eqnTimes = pow(x, 3.0*5.0)' in component 'my_component' are not equivalent. 'eqnTimes' is in 'second' while 'pow(x, 3.0*5.0)' is in 'second^15'.",
        "The units in 'eqnDivide = pow(x, 3.0/5.0)' in component 'my_component' are not equivalent. 'eqnDivide' is in 'second' while 'pow(x, 3.0/5.0)' is in 'second^0.6'.",
        "The units in 'eqnPower = pow(x, pow(3.0, 5.0))' in component 'my_component' are not equivalent. 'eqnPower' is in 'second' while 'pow(x, pow(3.0, 5.0))' is in 'second^243'.",
        "The units in 'eqnRoot = pow(x, pow(3.0, 1.0/5.0))' in component 'my_component' are not equivalent. 'eqnRoot' is in 'second' while 'pow(x, pow(3.0, 1.0/5.0))' is in 'second^1.24573'.",
        "The units in 'eqnRoot2 = pow(x, sqrt(3.0))' in component 'my_component' are not equivalent. 'eqnRoot2' is in 'second' while 'pow(x, sqrt(3.0))' is in 'second^1.73205'.",
        "The units in 'eqnAbs = pow(x, abs(-3.0))' in component 'my_component' are not equivalent. 'eqnAbs' is in 'second' while 'pow(x, abs(-3.0))' is in 'second^3'.",
        "The units in 'eqnExp = pow(x, exp(3.0))' in component 'my_component' are not equivalent. 'eqnExp' is in 'second' while 'pow(x, exp(3.0))' is in 'second^20.0855'.",
        "The units in 'eqnLn = pow(x, ln(3.0))' in component 'my_component' are not equivalent. 'eqnLn' is in 'second' while 'pow(x, ln(3.0))' is in 'second^1.09861'.",
        "The units in 'eqnLog = pow(x, log(3.0))' in component 'my_component' are not equivalent. 'eqnLog' is in 'second' while 'pow(x, log(3.0))' is in 'second^0.477121'.",
        "The units in 'eqnLog2 = pow(x, ln(3.0)/ln(2.0))' in component 'my_component' are not equivalent. 'eqnLog2' is in 'second' while 'pow(x, ln(3.0)/ln(2.0))' is in 'second^1.58496'.",
        "The units in 'eqnLog10 = pow(x, log(3.0))' in component 'my_component' are not equivalent. 'eqnLog10' is in 'second' while 'pow(x, log(3.0))' is in 'second^0.477121'.",
        "The units in 'eqnCeiling = pow(x, ceil(3.21))' in component 'my_component' are not equivalent. 'eqnCeiling' is in 'second' while 'pow(x, ceil(3.21))' is in 'second^4'.",
        "The units in 'eqnFloor = pow(x, floor(3.21))' in component 'my_component' are not equivalent. 'eqnFloor' is in 'second' while 'pow(x, floor(3.21))' is in 'second^3'.",
        "The units in 'eqnMin = pow(x, min(3.0, 5.0))' in component 'my_component' are not equivalent. 'eqnMin' is in 'second' while 'pow(x, min(3.0, 5.0))' is in 'second^3'.",
        "The units in 'eqnMin2 = pow(x, min(5.0, 3.0))' in component 'my_component' are not equivalent. 'eqnMin2' is in 'second' while 'pow(x, min(5.0, 3.0))' is in 'second^3'.",
        "The units in 'eqnMax = pow(x, max(3.0, 5.0))' in component 'my_component' are not equivalent. 'eqnMax' is in 'second' while 'pow(x, max(3.0, 5.0))' is in 'second^5'.",
        "The units in 'eqnMax2 = pow(x, max(5.0, 3.0))' in component 'my_component' are not equivalent. 'eqnMax2' is in 'second' while 'pow(x, max(5.0, 3.0))' is in 'second^5'.",
        "The units in 'eqnRem = pow(x, rem(3.0, 5.0))' in component 'my_component' are not equivalent. 'eqnRem' is in 'second' while 'pow(x, rem(3.0, 5.0))' is in 'second^3'.",
        "The units in 'eqnDiff = pow(x, dx/dt)' in component 'my_component' may not be equivalent. 'eqnDiff' is in 'second' while 'dx/dt' may result in 'pow(x, dx/dt)' having different units.",
        "The units in 'pow(x, dx/dt) = eqnDiff2' in component 'my_component' may not be equivalent. 'dx/dt' may result in 'pow(x, dx/dt)' having different units while 'eqnDiff2' is in 'second'.",
        "The units in 'pow(x, dx/dt) = pow(xx, dxx/dt)' in component 'my_component' may not be equivalent. 'dx/dt' may result in 'pow(x, dx/dt)' having different units while 'dxx/dt' may result in 'pow(xx, dxx/dt)' having different units.",
        "The units in 'eqnSin = pow(x, sin(3.0))' in component 'my_component' are not equivalent. 'eqnSin' is in 'second' while 'pow(x, sin(3.0))' is in 'second^0.14112'.",
        "The units in 'eqnCos = pow(x, cos(3.0))' in component 'my_component' are not equivalent. 'eqnCos' is in 'second' while 'pow(x, cos(3.0))' is in 'second^-0.989992'.",
        "The units in 'eqnTan = pow(x, tan(3.0))' in component 'my_component' are not equivalent. 'eqnTan' is in 'second' while 'pow(x, tan(3.0))' is in 'second^-0.142547'.",
        "The units in 'eqnSec = pow(x, sec(3.0))' in component 'my_component' are not equivalent. 'eqnSec' is in 'second' while 'pow(x, sec(3.0))' is in 'second^-1.01011'.",
        "The units in 'eqnCsc = pow(x, csc(3.0))' in component 'my_component' are not equivalent. 'eqnCsc' is in 'second' while 'pow(x, csc(3.0))' is in 'second^7.08617'.",
        "The units in 'eqnCot = pow(x, cot(3.0))' in component 'my_component' are not equivalent. 'eqnCot' is in 'second' while 'pow(x, cot(3.0))' is in 'second^-7.01525'.",
        "The units in 'eqnSinh = pow(x, sinh(3.0))' in component 'my_component' are not equivalent. 'eqnSinh' is in 'second' while 'pow(x, sinh(3.0))' is in 'second^10.0179'.",
        "The units in 'eqnCosh = pow(x, cosh(3.0))' in component 'my_component' are not equivalent. 'eqnCosh' is in 'second' while 'pow(x, cosh(3.0))' is in 'second^10.0677'.",
        "The units in 'eqnTanh = pow(x, tanh(3.0))' in component 'my_component' are not equivalent. 'eqnTanh' is in 'second' while 'pow(x, tanh(3.0))' is in 'second^0.995055'.",
        "The units in 'eqnSech = pow(x, sech(3.0))' in component 'my_component' are not equivalent. 'eqnSech' is in 'second' while 'pow(x, sech(3.0))' is in 'second^0.0993279'.",
        "The units in 'eqnCsch = pow(x, csch(3.0))' in component 'my_component' are not equivalent. 'eqnCsch' is in 'second' while 'pow(x, csch(3.0))' is in 'second^0.0998216'.",
        "The units in 'eqnCoth = pow(x, coth(3.0))' in component 'my_component' are not equivalent. 'eqnCoth' is in 'second' while 'pow(x, coth(3.0))' is in 'second^1.00497'.",
        "The units in 'eqnArcsin = pow(x, arcsin(0.3))' in component 'my_component' are not equivalent. 'eqnArcsin' is in 'second' while 'pow(x, arcsin(0.3))' is in 'second^0.304693'.",
        "The units in 'eqnArccos = pow(x, arccos(0.3))' in component 'my_component' are not equivalent. 'eqnArccos' is in 'second' while 'pow(x, arccos(0.3))' is in 'second^1.2661'.",
        "The units in 'eqnArctan = pow(x, arctan(3.0))' in component 'my_component' are not equivalent. 'eqnArctan' is in 'second' while 'pow(x, arctan(3.0))' is in 'second^1.24905'.",
        "The units in 'eqnArcsec = pow(x, arcsec(3.0))' in component 'my_component' are not equivalent. 'eqnArcsec' is in 'second' while 'pow(x, arcsec(3.0))' is in 'second^1.23096'.",
        "The units in 'eqnArccsc = pow(x, arccsc(3.0))' in component 'my_component' are not equivalent. 'eqnArccsc' is in 'second' while 'pow(x, arccsc(3.0))' is in 'second^0.339837'.",
        "The units in 'eqnArccot = pow(x, arccot(3.0))' in component 'my_component' are not equivalent. 'eqnArccot' is in 'second' while 'pow(x, arccot(3.0))' is in 'second^0.321751'.",
        "The units in 'eqnArcsinh = pow(x, arcsinh(3.0))' in component 'my_component' are not equivalent. 'eqnArcsinh' is in 'second' while 'pow(x, arcsinh(3.0))' is in 'second^1.81845'.",
        "The units in 'eqnArccosh = pow(x, arccosh(3.0))' in component 'my_component' are not equivalent. 'eqnArccosh' is in 'second' while 'pow(x, arccosh(3.0))' is in 'second^1.76275'.",
        "The units in 'eqnArctanh = pow(x, arctanh(0.3))' in component 'my_component' are not equivalent. 'eqnArctanh' is in 'second' while 'pow(x, arctanh(0.3))' is in 'second^0.30952'.",
        "The units in 'eqnArcsech = pow(x, arcsech(0.3))' in component 'my_component' are not equivalent. 'eqnArcsech' is in 'second' while 'pow(x, arcsech(0.3))' is in 'second^1.87382'.",
        "The units in 'eqnArccsch = pow(x, arccsch(3.0))' in component 'my_component' are not equivalent. 'eqnArccsch' is in 'second' while 'pow(x, arccsch(3.0))' is in 'second^0.32745'.",
        "The units in 'eqnArccoth = pow(x, arccoth(3.0))' in component 'my_component' are not equivalent. 'eqnArccoth' is in 'second' while 'pow(x, arccoth(3.0))' is in 'second^0.346574'.",
        "The units in 'eqnPiecewise = pow(x, (y > 5.0)?3.0:7.0)' in component 'my_component' may not be equivalent. 'eqnPiecewise' is in 'second' while '(y > 5.0)?3.0:7.0' may result in 'pow(x, (y > 5.0)?3.0:7.0)' having different units.",
        "The units in 'eqnCi = pow(x, y)' in component 'my_component' are not equivalent. 'eqnCi' is in 'second' while 'pow(x, y)' is in 'second^3'.",
        "The units in 'eqnCi2 = pow(x, z)' in component 'my_component' are equivalent as long as the value of 'z' is equal to '1.0'.",
        "The units in 'eqnCi3 = pow(x, 3.0*z)' in component 'my_component' are equivalent as long as the value of '3.0*z' is equal to '3.0'.",
        "The units in 'eqnCi4 = pow(x, y+z)' in component 'my_component' are equivalent as long as the value of 'y+z' is equal to '4.0'.",
        "The units in 'eqnCi5 = pow(x, pow(y-z, y-z)+1.0)' in component 'my_component' are equivalent as long as the value of 'pow(y-z, y-z)+1.0' is equal to '5.0'.",
        "The units in 'eqnCn = pow(x, 3.0)' in component 'my_component' are not equivalent. 'eqnCn' is in 'second' while 'pow(x, 3.0)' is in 'second^3'.",
        "The units in 'eqnFalse = pow(x, false)' in component 'my_component' are not equivalent. 'eqnFalse' is in 'second' while 'pow(x, false)' is 'dimensionless'.",
        "The units in 'eqnExponentiale = pow(x, exponentiale)' in component 'my_component' are not equivalent. 'eqnExponentiale' is in 'second' while 'pow(x, exponentiale)' is in 'second^2.71828'.",
        "The units in 'eqnPi = pow(x, pi)' in component 'my_component' are not equivalent. 'eqnPi' is in 'second' while 'pow(x, pi)' is in 'second^3.14159'.",
        "The units in 'eqnInfinity = pow(x, infinity)' in component 'my_component' are not equivalent. 'eqnInfinity' is in 'second' while 'pow(x, infinity)' is in 'second^inf' (i.e. '10^nan x second^inf').",
        "The units in 'eqnNotanumber = pow(x, notanumber)' in component 'my_component' are not equivalent. 'eqnNotanumber' is in 'second' while 'pow(x, notanumber)' is in 'second^nan' (i.e. '10^nan x second^nan').",
        "The type of variable 'u' in component 'my_component' is unknown.",
        "The type of variable 'eqnCoverage' in component 'my_component' is unknown.",
        "The type of variable 'eqnCoverage2' in component 'my_component' is unknown.",
        "The type of variable 'eqnCoverage3' in component 'my_component' is unknown.",
    };

    auto analyser = libcellml::Analyser::create();

    analyser->analyseModel(model);

    EXPECT_EQ_ISSUES(expectedIssues, analyser);
}